

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void FreeMp3(drmp3 *mp3)

{
  void *pvVar1;
  _func_void_void_ptr_void_ptr *p_Var2;
  
  pvVar1 = mp3->pUserData;
  if (pvVar1 != (void *)0x0) {
    if (((mp3 != (drmp3 *)0x0) && (mp3->pData != (drmp3_uint8 *)0x0)) &&
       (p_Var2 = (mp3->allocationCallbacks).onFree, p_Var2 != (_func_void_void_ptr_void_ptr *)0x0))
    {
      (*p_Var2)(mp3->pData,(mp3->allocationCallbacks).pUserData);
    }
    mp3->pUserData = (void *)0x0;
    (**(code **)((long)pvVar1 + 0x20))(pvVar1);
    return;
  }
  return;
}

Assistant:

static void
FreeMp3(drmp3 *mp3)
{
    SDL_RWops *rw = (SDL_RWops *) mp3->pUserData;
    if (rw) {
        drmp3_uninit(mp3);
        mp3->pUserData = NULL;
        SDL20_RWclose(rw);
    }
}